

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O3

int GmfWriteByteFlow(int64_t MshIdx,char *BytTab,int NmbByt)

{
  int iVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  
  uVar7 = NmbByt + 3;
  if (-1 < NmbByt) {
    uVar7 = NmbByt;
  }
  uVar5 = uVar7 & 0xfffffffc;
  iVar3 = 0;
  iVar1 = GmfSetKwd(MshIdx,0x7e,(long)(int)((uint)((int)uVar5 < NmbByt) + ((int)uVar7 >> 2)));
  if (iVar1 != 0) {
    GmfSetLin(MshIdx,0x7e,(ulong)(uint)NmbByt);
    if (3 < NmbByt) {
      uVar4 = 0;
      do {
        GmfSetLin(MshIdx,0x7e,(ulong)*(uint *)(BytTab + uVar4 * 4));
        uVar4 = uVar4 + 1;
      } while ((uint)((int)uVar7 >> 2) != uVar4);
    }
    iVar3 = 1;
    if (NmbByt != uVar5 && SBORROW4(NmbByt,uVar5) == NmbByt % 4 < 0) {
      uVar7 = NmbByt % 4;
      if (uVar7 == 0 || SBORROW4(NmbByt,uVar5) != (int)uVar7 < 0) {
        uVar4 = 0;
      }
      else {
        pcVar6 = BytTab + (int)uVar5;
        lVar2 = 0;
        uVar4 = 0;
        do {
          uVar4 = (ulong)((uint)uVar4 | (int)*pcVar6 << ((byte)lVar2 & 0x1f));
          pcVar6 = pcVar6 + 1;
          lVar2 = lVar2 + 8;
        } while ((ulong)uVar7 << 3 != lVar2);
      }
      GmfSetLin(MshIdx,0x7e,uVar4);
    }
  }
  return iVar3;
}

Assistant:

int GmfWriteByteFlow(int64_t MshIdx, char *BytTab, int NmbByt)
{
   int i, PadWrd = 0, *WrdTab = (int *)BytTab, NmbWrd = NmbByt / WrdSiz;

   // Add an extra padding word at the end if needed
   if(NmbByt > NmbWrd * 4)
      PadWrd = 1;

   // Create the keyword with the number of words, not bytes
   if(!GmfSetKwd(MshIdx, GmfByteFlow, NmbWrd + PadWrd))
      return(0);

   // Reacord the exact number of bytes
   GmfSetLin(MshIdx, GmfByteFlow, NmbByt);

   // Write the byteflow as 4-byte words, missing up to 3 endding bytes
   for(i=0;i<NmbWrd;i++)
      GmfSetLin(MshIdx, GmfByteFlow, WrdTab[i]);

   // Write the extra 1,2 or 3 ending bytes
   if(PadWrd)
   {
      PadWrd = 0;

      // Copy the last bytes in an integer
      for(i=0; i<NmbByt - NmbWrd * 4; i++)
         PadWrd |= BytTab[ NmbWrd * 4 + i ] << (i*8);

      // And write it as the last line
      GmfSetLin(MshIdx, GmfByteFlow, PadWrd);
   }

   return(1);
}